

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# self_test.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint in_EAX;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  lVar5 = 8;
  do {
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
         0x3c;
    lVar1 = *(long *)(lVar2 + -0x18);
    *(uint *)(strcmp + lVar1) = *(uint *)(strcmp + lVar1) & 0xffffff4f | 0x20;
    pcVar6 = *(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar5);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(lVar2 + -0x18) + 0x108080);
    }
    else {
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar4);
    }
    uStack_38._0_3_ = CONCAT12(0x20,(undefined2)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)((long)&uStack_38 + 2),1);
    (**(code **)((long)&PTR_anon_var_dwarf_88c2_00106a90 + lVar5))();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pass\n",5);
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x268);
  iVar3 = uStack_38._4_4_;
  pcVar6 = "\nbummer!";
  if (uStack_38._4_4_ == 0) {
    pcVar6 = "\ncool!";
  }
  puts(pcVar6);
  return iVar3;
}

Assistant:

int main()
{
  struct test {
    const char* name;
    void (*test_func)();
  };
  test tests[] = {
    {
        "== any_of",
        []{
            REQUIRE(zero == any_of(0,1,2));
            REQUIRE(zero == any_of(1,0,3));
            REQUIRE(zero == any_of(1,2,0));
            REQUIRE(!(zero == any_of(1,2,3)));
            REQUIRE(any_of(0,2,3) == zero);
            REQUIRE(any_of(1,0,3) == zero);
            REQUIRE(any_of(1,2,0) == zero);
            REQUIRE(!(any_of(1,2,3) == zero));
        }
    },
    {
        "== all_of",
        []{
            REQUIRE(!(zero == all_of(1,2,3)));
            REQUIRE(!(zero == all_of(0,1,2)));
            REQUIRE(!(zero == all_of(0,1,0)));
            REQUIRE(zero == all_of(0,0,0));
            REQUIRE(zero == all_of(0,0));
            REQUIRE(zero == all_of(0));
            REQUIRE(!(all_of(1,2,3) == zero));
            REQUIRE(!(all_of(0,1,2) == zero));
            REQUIRE(!(all_of(0,1,0) == zero));
            REQUIRE(all_of(0,0,0) == zero);
            REQUIRE(all_of(0,0) == zero);
            REQUIRE(all_of(0) == zero);
        }
    },
    {
      "== none_of",
      []{
          REQUIRE(zero == none_of(1,2,3));
          REQUIRE(zero == none_of(1,2));
          REQUIRE(zero == none_of(1));
          REQUIRE(!(zero == none_of(0,1,2)));
          REQUIRE(!(zero == none_of(1,2,0)));
          REQUIRE(!(zero == none_of(1,0,2)));
          REQUIRE(!(zero == none_of(0,1)));
          REQUIRE(!(zero == none_of(1,0)));
          REQUIRE(!(zero == none_of(0)));
          REQUIRE(zero == none_of(1));
      }
    },
    {
      "!= any_of",
      []{
          REQUIRE(zero != any_of(1,2,3));
          REQUIRE(!(zero != any_of(0,1,2)));
          REQUIRE(!(zero != any_of(1,2,0)));
          REQUIRE(!(zero != any_of(1,0,2)));
          REQUIRE(!(zero != any_of(0,1)));
          REQUIRE(!(zero != any_of(1,0)));
          REQUIRE(!(zero != any_of(0)));
          REQUIRE(zero != any_of(1));
          REQUIRE(any_of(1,2,3) != zero);
          REQUIRE(!(any_of(0,1,2) != zero));
          REQUIRE(!(any_of(1,2,0) != zero));
          REQUIRE(!(any_of(1,0,2) != zero));
          REQUIRE(!(any_of(0,1) != zero));
          REQUIRE(!(any_of(1,0) != zero));
          REQUIRE(!(any_of(0) != zero));
          REQUIRE(any_of(1) != zero);
      }
    },
    {
        "!= all_of",
        [] {
            REQUIRE(zero != all_of(1, 2, 3));
            REQUIRE(zero != all_of(0,1,2));
            REQUIRE(zero != all_of(1,0,2));
            REQUIRE(zero != all_of(1,2,0));
            REQUIRE(zero != all_of(1,2));
            REQUIRE(zero != all_of(0,1));
            REQUIRE(zero != all_of(1,0));
            REQUIRE(zero != all_of(1));
            REQUIRE(!(zero != all_of(0)));
            REQUIRE(!(zero != all_of(0,0)));
            REQUIRE(!(zero != all_of(0,0,0)));
            REQUIRE(all_of(1, 2, 3) != zero);
            REQUIRE(all_of(0,1,2) != zero);
            REQUIRE(all_of(1,0,2) != zero);
            REQUIRE(all_of(1,2,0) != zero);
            REQUIRE(all_of(1,2) != zero);
            REQUIRE(all_of(0,1) != zero);
            REQUIRE(all_of(1,0) != zero);
            REQUIRE(all_of(1) != zero);
            REQUIRE(!(all_of(0) != zero));
            REQUIRE(!(all_of(0,0) != zero));
            REQUIRE(!(all_of(0,0,0) != zero));
        }
    },
    {
        "!= none_of",
        []{
            REQUIRE(!(zero != none_of(1,2,3)));
            REQUIRE(zero != none_of(0,1,2));
            REQUIRE(zero != none_of(1,0,2));
            REQUIRE(zero != none_of(1,2,0));
            REQUIRE(!(zero != none_of(1,2)));
            REQUIRE(zero != none_of(0,1));
            REQUIRE(zero != none_of(1,0));
            REQUIRE(zero != none_of(0));
            REQUIRE(!(zero != none_of(1)));
            REQUIRE(!(none_of(1,2,3) != zero));
            REQUIRE(none_of(0,1,2) != zero);
            REQUIRE(none_of(1,0,2) != zero);
            REQUIRE(none_of(1,2,0) != zero);
            REQUIRE(!(none_of(1,2) != zero));
            REQUIRE(none_of(0,1) != zero);
            REQUIRE(none_of(1,0) != zero);
            REQUIRE(none_of(0) != zero);
            REQUIRE(!(none_of(1) != zero));
        }
    },
    {
        "< any_of",
        []{
            REQUIRE(zero < any_of(0,0,1));
            REQUIRE(zero < any_of(0,1,0));
            REQUIRE(zero < any_of(1,0,0));
            REQUIRE(!(zero < any_of(0,0,0)));
            REQUIRE(zero < any_of(0,1));
            REQUIRE(zero < any_of(1,0));
            REQUIRE(!(zero < any_of(0,0)));
            REQUIRE(zero < any_of(1));
            REQUIRE(!(zero < any_of(0)));
            REQUIRE(any_of(0,0,1) > zero);
            REQUIRE(any_of(0,1,0) > zero);
            REQUIRE(any_of(1,0,0) > zero);
            REQUIRE(!(any_of(0,0,0) > zero));
            REQUIRE(any_of(0,1) > zero);
            REQUIRE(any_of(1,0) > zero);
            REQUIRE(!(any_of(0,0) > zero));
            REQUIRE(any_of(1) > zero);
            REQUIRE(!(any_of(0) > zero));
        }
    },
    {
        "< all_of",
        []{
            REQUIRE(zero < all_of(1,2,3));
            REQUIRE(!(zero < all_of(0,1,2)));
            REQUIRE(!(zero < all_of(1,0,2)));
            REQUIRE(!(zero < all_of(1,2,0)));
            REQUIRE(zero < all_of(1,2));
            REQUIRE(!(zero < all_of(0,1)));
            REQUIRE(!(zero < all_of(1,0)));
            REQUIRE(zero < all_of(1));
            REQUIRE(!(zero < all_of(0)));
            REQUIRE(all_of(1,2,3) > zero);
            REQUIRE(!(all_of(0,1,2) > zero));
            REQUIRE(!(all_of(1,0,2) > zero));
            REQUIRE(!(all_of(1,2,0) > zero));
            REQUIRE(all_of(1,2) > zero);
            REQUIRE(!(all_of(0,1) > zero));
            REQUIRE(!(all_of(1,0) > zero));
            REQUIRE(all_of(1) > zero);
            REQUIRE(!(all_of(0) > zero));
        }
    },
    {
      "< none_of",
      []{
          REQUIRE(zero < none_of(0,0,0));
          REQUIRE(!(zero < none_of(1,0,0)));
          REQUIRE(!(zero < none_of(0,1,0)));
          REQUIRE(!(zero < none_of(0,0,1)));
          REQUIRE(zero < none_of(0,0));
          REQUIRE(!(zero < none_of(1,0)));
          REQUIRE(!(zero < none_of(0,1)));
          REQUIRE(zero < none_of(0));
          REQUIRE(!(zero < none_of(1)));
          REQUIRE(none_of(0,0,0) > zero);
          REQUIRE(!(none_of(1,0,0) > zero));
          REQUIRE(!(none_of(0,1,0) > zero));
          REQUIRE(!(none_of(0,0,1) > zero));
          REQUIRE(none_of(0,0) > zero);
          REQUIRE(!(none_of(1,0) > zero));
          REQUIRE(!(none_of(0,1) > zero));
          REQUIRE(none_of(0) > zero);
          REQUIRE(!(none_of(1) > zero));
      }
    },
    {
        "<= any_of",
        []{
            REQUIRE(!(zero <= any_of(-1,-1,-1)));
            REQUIRE(zero <= any_of(0,-1,-1));
            REQUIRE(zero <= any_of(-1,0,-1));
            REQUIRE(zero <= any_of(-1,-1,0));
            REQUIRE(zero <= any_of(0,-1));
            REQUIRE(zero <= any_of(-1,0));
            REQUIRE(!(zero <= any_of(-1,-1)));
            REQUIRE(zero <= any_of(0));
            REQUIRE(!(zero <= any_of(-1)));
            REQUIRE(!(any_of(-1,-1,-1) >= zero));
            REQUIRE(any_of(0,-1,-1) >= zero);
            REQUIRE(any_of(-1,0,-1) >= zero);
            REQUIRE(any_of(-1,-1,0) >= zero);
            REQUIRE(any_of(0,-1) >= zero);
            REQUIRE(any_of(-1,0) >= zero);
            REQUIRE(!(any_of(-1,-1) >= zero));
            REQUIRE(any_of(0) >= zero);
            REQUIRE(!(any_of(-1) >= zero));
        }
    },
    {
        "<= all_of",
        []{
            REQUIRE(zero <= all_of(0,0,0));
            REQUIRE(!(zero <= all_of(0,-1,-1)));
            REQUIRE(!(zero <= all_of(-1,0,-1)));
            REQUIRE(!(zero <= all_of(-1,-1,0)));
            REQUIRE(zero <= all_of(0,0));
            REQUIRE(!(zero <= all_of(0,-1)));
            REQUIRE(!(zero <= all_of(-1,0)));
            REQUIRE(zero <= all_of(0));
            REQUIRE(!(zero <= all_of(-1)));
            REQUIRE(all_of(0,0,0) >= zero);
            REQUIRE(!(all_of(0,-1,-1) >= zero));
            REQUIRE(!(all_of(-1,0,-1) >= zero));
            REQUIRE(!(all_of(-1,-1,0) >= zero));
            REQUIRE(all_of(0,0) >= zero);
            REQUIRE(!(all_of(0,-1) >= zero));
            REQUIRE(!(all_of(-1,0) >= zero));
            REQUIRE(all_of(0) >= zero);
            REQUIRE(!(all_of(-1) >= zero));
        }
    },
    {
        "<= none_of",
        []{
            REQUIRE(zero <= none_of(-1,-1,-1));
            REQUIRE(!(zero <= none_of(0,-1,-1)));
            REQUIRE(!(zero <= none_of(-1,0,-1)));
            REQUIRE(!(zero <= none_of(-1,-1,0)));
            REQUIRE(zero <= none_of(-1,-1));
            REQUIRE(!(zero <= none_of(-1,0)));
            REQUIRE(!(zero <= none_of(0,-1)));
            REQUIRE(zero <= none_of(-1));
            REQUIRE(!(zero <= none_of(0)));
            REQUIRE(none_of(-1,-1,-1) >= zero);
            REQUIRE(!(none_of(0,-1,-1) >= zero));
            REQUIRE(!(none_of(-1,0,-1) >= zero));
            REQUIRE(!(none_of(-1,-1,0) >= zero));
            REQUIRE(none_of(-1,-1) >= zero);
            REQUIRE(!(none_of(-1,0) >= zero));
            REQUIRE(!(none_of(0,-1) >= zero));
            REQUIRE(none_of(-1) >= zero);
            REQUIRE(!(none_of(0) >= zero));
        }
    },
    ///
    {
        "> any_of",
        []{
            REQUIRE(zero > any_of(0,0,-1));
            REQUIRE(zero > any_of(0,-1,0));
            REQUIRE(zero > any_of(-1,0,0));
            REQUIRE(!(zero > any_of(0,0,0)));
            REQUIRE(zero > any_of(0,-1));
            REQUIRE(zero > any_of(-1,0));
            REQUIRE(!(zero > any_of(0,0)));
            REQUIRE(zero > any_of(-1));
            REQUIRE(!(zero > any_of(0)));
            REQUIRE(any_of(0,0,-1) < zero);
            REQUIRE(any_of(0,-1,0) < zero);
            REQUIRE(any_of(-1,0,0) < zero);
            REQUIRE(!(any_of(0,0,0) < zero));
            REQUIRE(any_of(0,-1) < zero);
            REQUIRE(any_of(-1,0) < zero);
            REQUIRE(!(any_of(0,0) < zero));
            REQUIRE(any_of(-1) < zero);
            REQUIRE(!(any_of(0) < zero));
        }
    },
    {
        "> all_of",
        []{
            REQUIRE(zero > all_of(-1,-2,-3));
            REQUIRE(!(zero > all_of(0,-1,-2)));
            REQUIRE(!(zero > all_of(-1,0,-2)));
            REQUIRE(!(zero > all_of(-1,-2,0)));
            REQUIRE(zero > all_of(-1,-2));
            REQUIRE(!(zero > all_of(0,-1)));
            REQUIRE(!(zero > all_of(-1,0)));
            REQUIRE(zero > all_of(-1));
            REQUIRE(!(zero > all_of(0)));
            REQUIRE(all_of(-1,-2,-3) < zero);
            REQUIRE(!(all_of(0,-1,-2) < zero));
            REQUIRE(!(all_of(-1,0,-2) < zero));
            REQUIRE(!(all_of(-1,-2,0) < zero));
            REQUIRE(all_of(-1,-2) < zero);
            REQUIRE(!(all_of(0,-1) < zero));
            REQUIRE(!(all_of(-1,0) < zero));
            REQUIRE(all_of(-1) < zero);
            REQUIRE(!(all_of(0) < zero));
        }
    },
    {
        "> none_of",
        []{
            REQUIRE(zero > none_of(0,0,0));
            REQUIRE(!(zero > none_of(-1,0,0)));
            REQUIRE(!(zero > none_of(0,-1,0)));
            REQUIRE(!(zero > none_of(0,0,-1)));
            REQUIRE(zero > none_of(0,0));
            REQUIRE(!(zero > none_of(-1,0)));
            REQUIRE(!(zero > none_of(0,-1)));
            REQUIRE(zero > none_of(0));
            REQUIRE(!(zero > none_of(-1)));
            REQUIRE(none_of(0,0,0) < zero);
            REQUIRE(!(none_of(-1,0,0) < zero));
            REQUIRE(!(none_of(0,-1,0) < zero));
            REQUIRE(!(none_of(0,0,-1) < zero));
            REQUIRE(none_of(0,0) < zero);
            REQUIRE(!(none_of(-1,0) < zero));
            REQUIRE(!(none_of(0,-1) < zero));
            REQUIRE(none_of(0) < zero);
            REQUIRE(!(none_of(-1) < zero));
        }
    },
    {
        ">= any_of",
        []{
            REQUIRE(!(zero >= any_of(1,1,1)));
            REQUIRE(zero >= any_of(0,1,1));
            REQUIRE(zero >= any_of(1,0,1));
            REQUIRE(zero >= any_of(1,1,0));
            REQUIRE(zero >= any_of(0,1));
            REQUIRE(zero >= any_of(1,0));
            REQUIRE(!(zero >= any_of(1,1)));
            REQUIRE(zero >= any_of(0));
            REQUIRE(!(zero >= any_of(1)));
            REQUIRE(!(any_of(1,1,1) <= zero));
            REQUIRE(any_of(0,1,1) <= zero);
            REQUIRE(any_of(1,0,1) <= zero);
            REQUIRE(any_of(1,1,0) <= zero);
            REQUIRE(any_of(0,1) <= zero);
            REQUIRE(any_of(1,0) <= zero);
            REQUIRE(!(any_of(1,1) <= zero));
            REQUIRE(any_of(0) <= zero);
            REQUIRE(!(any_of(1) <= zero));
        }
    },
    {
        ">= all_of",
        []{
            REQUIRE(zero >= all_of(0,0,0));
            REQUIRE(!(zero >= all_of(0,1,1)));
            REQUIRE(!(zero >= all_of(1,0,1)));
            REQUIRE(!(zero >= all_of(1,1,0)));
            REQUIRE(zero >= all_of(0,0));
            REQUIRE(!(zero >= all_of(0,1)));
            REQUIRE(!(zero >= all_of(1,0)));
            REQUIRE(zero >= all_of(0));
            REQUIRE(!(zero >= all_of(1)));
            REQUIRE(all_of(0,0,0) <= zero);
            REQUIRE(!(all_of(0,1,1) <= zero));
            REQUIRE(!(all_of(1,0,1) <= zero));
            REQUIRE(!(all_of(1,1,0) <= zero));
            REQUIRE(all_of(0,0) <= zero);
            REQUIRE(!(all_of(0,1) <= zero));
            REQUIRE(!(all_of(1,0) <= zero));
            REQUIRE(all_of(0) <= zero);
            REQUIRE(!(all_of(1) <= zero));
        }
    },
    {
        ">= none_of",
        []{
            REQUIRE(zero >= none_of(1,1,1));
            REQUIRE(!(zero >= none_of(0,1,1)));
            REQUIRE(!(zero >= none_of(1,0,1)));
            REQUIRE(!(zero >= none_of(1,1,0)));
            REQUIRE(zero >= none_of(1,1));
            REQUIRE(!(zero >= none_of(1,0)));
            REQUIRE(!(zero >= none_of(0,1)));
            REQUIRE(zero >= none_of(1));
            REQUIRE(!(zero >= none_of(0)));
            REQUIRE(none_of(1,1,1) <= zero);
            REQUIRE(!(none_of(0,1,1) <= zero));
            REQUIRE(!(none_of(1,0,1) <= zero));
            REQUIRE(!(none_of(1,1,0) <= zero));
            REQUIRE(none_of(1,1) <= zero);
            REQUIRE(!(none_of(1,0) <= zero));
            REQUIRE(!(none_of(0,1) <= zero));
            REQUIRE(none_of(1) <= zero);
            REQUIRE(!(none_of(0) <= zero));
        }
    },
    {
        "any_of(...)",
        []{
            REQUIRE(any_of(negate, next)(1) < 0);
            REQUIRE(!(any_of(negate, next)(zero) < 0));
        }
    },
    {
        "all_of(...)",
        []{
            REQUIRE(all_of(negate, next)(zero) >= 0);
            REQUIRE(all_of(negate, next)(-1) >= 0);
        }
    },
    {
        "none_of(...)",
        []{
            REQUIRE(none_of(negate, next)(zero) < 0);
            REQUIRE(none_of(negate, next)(-1) < 0);
        }
    },
    {
      "print any_of",
      []{
        std::ostringstream os;
        os << any_of{1,3,5};
        auto s = os.str();
        REQUIRE(s == "any_of{1,3,5}");
      }
    },
    {
      "print none_of",
      []{
        std::ostringstream os;
        os << none_of{1,2,3};
        auto s = os.str();
        REQUIRE(s == "none_of{1,2,3}");
      }
    },
    {
      "print all_of",
      []{
        std::ostringstream os;
        os << all_of{1,2,3};
        auto s = os.str();
        REQUIRE(s == "all_of{1,2,3}");
      }
    },
    {
      "all_of is true if all members are true",
      []{
        int v;
        auto b = bool(all_of{true, 1, &v});
        REQUIRE(b);
      }
    },
    {
      "all_of is false with nullptr",
      []{
        auto b = bool(all_of{true, 1, nullstr});
        REQUIRE(!b);
      }
    },
    {
      "all_of is false with int(0)",
      [] {
        int v = 0;
        auto b = bool(all_of{true, v, &v});
        REQUIRE(!b);
      }
    },
    {
      "all_of isfalse with false member",
      [] {
        int v = 1;
        auto b = bool(all_of(false, v, &v));
        REQUIRE(!b);
      }
    },
    {
      "none_of is true if all members are false",
      []{
        int v = 0;
        auto b = bool(none_of{false, v, nullstr});
        REQUIRE(b);
      }
    },
    {
      "none_of is false if a member is a non-nullptr",
      []{
        int v = 0;
        auto b = bool(none_of{false, v, &v});
        REQUIRE(!b);
      }
    },
    {
      "none_of is false if a member is a non-zero int",
      []{
        int v = 1;
        auto b = bool(none_of{false, v, nullstr});
        REQUIRE(!b);
      }
    },
    {
      "none_of is false if a member true",
      []{
        int v = 0;
        auto b = bool(none_of{true, v, nullstr});
        REQUIRE(!b);
      }
    },
    {
      "any_of is false all members are false",
      []{
        int v = 0;
        auto b = bool(any_of{false, v, nullstr});
        REQUIRE(!b);
      }
    },
    {
      "any_of is true if a member is a non-nullptr",
      []{
        int v = 0;
        auto b = bool(any_of{false, v, &v});
        REQUIRE(b);
      }
    },
    {
      "any_of is true if a member is a non-zero int",
      []{
        int v = 1;
        auto b = bool(any_of{false, v, nullstr});
        REQUIRE(b);
      }
    },
    {
      "any_of is true if a member is true",
      []{
        int v = 0;
        auto b = bool(any_of{true, v, nullstr});
        REQUIRE(b);
      }
    },
    {
        "binding an lvalue reference keeps a reference",
        []{
            auto p = std::make_shared<int>(3);
            auto cond = all_of{[](auto&& v) -> bool{ return v.get();}}(p);
            REQUIRE(p.use_count() == 1U);
            REQUIRE(cond);
        }
    },
    {
        "binding an rvalue reference copies an instance",
        []{
            auto cond = all_of{[](auto&& v) { return v.use_count() == 1;}}(std::make_shared<int>(3));
            REQUIRE(cond);
        }

    }

  };
  int failures = 0;
  for (auto& t : tests)
  {
    try {
      std::cout << std::setw(60) << std::left << t.name << ' ';
      t.test_func();
      std::cout << "pass\n";
    }
    catch (const char* m)
    {
      ++failures;
      std::cout << "failed: " << m << '\n';
    }
  }
  if (!failures)
  {
    std::puts("\ncool!");
  }
  else
  {
    std::puts("\nbummer!");
  }
  return failures;
}